

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int xmlCheckLanguageID(xmlChar *lang)

{
  byte bVar1;
  xmlChar xVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte *pbVar8;
  xmlChar *cur;
  long lVar9;
  
  if (lang == (xmlChar *)0x0) goto LAB_00131a35;
  bVar1 = *lang;
  if (0x68 < bVar1) {
    if (bVar1 == 0x78) {
      if (lang[1] != '-') goto LAB_0013185c;
    }
    else {
      pbVar8 = lang;
      if ((bVar1 != 0x69) || (lang[1] != '-')) goto LAB_0013188d;
    }
LAB_0013186d:
    pbVar8 = lang + 2;
    do {
      bVar1 = *pbVar8;
      pbVar8 = pbVar8 + 1;
    } while ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a);
    bVar3 = bVar1 == 0;
    goto LAB_00131a37;
  }
  if (bVar1 == 0x49) {
    xVar2 = lang[1];
joined_r0x0013186b:
    pbVar8 = lang;
    if (xVar2 == '-') goto LAB_0013186d;
  }
  else {
LAB_0013185c:
    pbVar8 = lang;
    if (bVar1 == 0x58) {
      xVar2 = lang[1];
      goto joined_r0x0013186b;
    }
  }
LAB_0013188d:
  do {
    pbVar7 = pbVar8;
    bVar1 = *pbVar7;
    pbVar8 = pbVar7 + 1;
  } while ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a);
  lVar4 = (long)pbVar7 - (long)lang;
  if (3 < lVar4) {
    bVar3 = bVar1 == 0 && lVar4 < 9;
    goto LAB_00131a37;
  }
  if (1 < lVar4) {
    bVar3 = true;
    if (bVar1 == 0) goto LAB_00131a37;
    if (bVar1 == 0x2d) {
      pbVar6 = pbVar7;
      if ((byte)(pbVar7[1] - 0x30) < 10) {
LAB_001318ea:
        pbVar6 = pbVar6 + 1;
LAB_001318ed:
        if (((byte)(pbVar6[1] - 0x30) < 10) && ((byte)(pbVar6[2] - 0x30) < 10)) {
          pbVar6 = pbVar6 + 3;
LAB_00131a08:
          if (*pbVar6 == 0) goto LAB_00131a37;
          if (*pbVar6 == 0x2d) {
            uVar5 = 0xfffffffffffffff6;
            do {
              pbVar8 = pbVar6 + 1;
              pbVar6 = pbVar6 + 1;
              uVar5 = uVar5 + 1;
            } while ((byte)((*pbVar8 & 0xdf) + 0xbf) < 0x1a);
            if (0xfffffffffffffffb < uVar5) goto LAB_00131a47;
          }
        }
      }
      else {
        lVar9 = 1;
        uVar5 = 0xfffffffffffffffa;
        lVar4 = 0;
        do {
          bVar1 = pbVar7[uVar5 + 7];
          lVar9 = lVar9 + -1;
          lVar4 = lVar4 + -1;
          uVar5 = uVar5 + 1;
        } while ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a);
        pbVar6 = pbVar8 + -lVar9;
        if (lVar9 == -2) goto LAB_00131a08;
        if (lVar9 == -4) {
LAB_00131959:
          if (*pbVar6 == 0) goto LAB_00131a37;
          if (*pbVar6 == 0x2d) {
            if ((byte)(pbVar6[1] - 0x30) < 10) goto LAB_001318ea;
            uVar5 = 0xfffffffffffffffa;
            do {
              pbVar8 = pbVar6 + 1;
              pbVar6 = pbVar6 + 1;
              uVar5 = uVar5 + 1;
            } while ((byte)((*pbVar8 & 0xdf) + 0xbf) < 0x1a);
            if (uVar5 < 4) goto LAB_00131a47;
            if (uVar5 == 0xfffffffffffffffd) goto LAB_00131a08;
          }
        }
        else {
          if (uVar5 < 4) {
LAB_00131a47:
            bVar3 = *pbVar6 == 0x2d || *pbVar6 == 0;
            goto LAB_00131a37;
          }
          if (uVar5 == 0xfffffffffffffffe) {
            if (bVar1 == 0) goto LAB_00131a37;
            if (bVar1 == 0x2d) {
              if ((byte)(pbVar7[5] - 0x30) < 10) {
                pbVar6 = pbVar8 + -lVar4;
                goto LAB_001318ed;
              }
              lVar4 = 6;
              do {
                pbVar8 = pbVar6 + 1;
                pbVar6 = pbVar6 + 1;
                lVar4 = lVar4 + -1;
              } while ((byte)((*pbVar8 & 0xdf) + 0xbf) < 0x1a);
              if (lVar4 == 3) goto LAB_00131a08;
              if ((ulong)-lVar4 < 4) goto LAB_00131a47;
              if (lVar4 == 1) goto LAB_00131959;
            }
          }
        }
      }
    }
  }
LAB_00131a35:
  bVar3 = false;
LAB_00131a37:
  return (int)bVar3;
}

Assistant:

int
xmlCheckLanguageID(const xmlChar * lang)
{
    const xmlChar *cur = lang, *nxt;

    if (cur == NULL)
        return (0);
    if (((cur[0] == 'i') && (cur[1] == '-')) ||
        ((cur[0] == 'I') && (cur[1] == '-')) ||
        ((cur[0] == 'x') && (cur[1] == '-')) ||
        ((cur[0] == 'X') && (cur[1] == '-'))) {
        /*
         * Still allow IANA code and user code which were coming
         * from the previous version of the XML-1.0 specification
         * it's deprecated but we should not fail
         */
        cur += 2;
        while (((cur[0] >= 'A') && (cur[0] <= 'Z')) ||
               ((cur[0] >= 'a') && (cur[0] <= 'z')))
            cur++;
        return(cur[0] == 0);
    }
    nxt = cur;
    while (((nxt[0] >= 'A') && (nxt[0] <= 'Z')) ||
           ((nxt[0] >= 'a') && (nxt[0] <= 'z')))
           nxt++;
    if (nxt - cur >= 4) {
        /*
         * Reserved
         */
        if ((nxt - cur > 8) || (nxt[0] != 0))
            return(0);
        return(1);
    }
    if (nxt - cur < 2)
        return(0);
    /* we got an ISO 639 code */
    if (nxt[0] == 0)
        return(1);
    if (nxt[0] != '-')
        return(0);

    nxt++;
    cur = nxt;
    /* now we can have extlang or script or region or variant */
    if ((nxt[0] >= '0') && (nxt[0] <= '9'))
        goto region_m49;

    while (((nxt[0] >= 'A') && (nxt[0] <= 'Z')) ||
           ((nxt[0] >= 'a') && (nxt[0] <= 'z')))
           nxt++;
    if (nxt - cur == 4)
        goto script;
    if (nxt - cur == 2)
        goto region;
    if ((nxt - cur >= 5) && (nxt - cur <= 8))
        goto variant;
    if (nxt - cur != 3)
        return(0);
    /* we parsed an extlang */
    if (nxt[0] == 0)
        return(1);
    if (nxt[0] != '-')
        return(0);

    nxt++;
    cur = nxt;
    /* now we can have script or region or variant */
    if ((nxt[0] >= '0') && (nxt[0] <= '9'))
        goto region_m49;

    while (((nxt[0] >= 'A') && (nxt[0] <= 'Z')) ||
           ((nxt[0] >= 'a') && (nxt[0] <= 'z')))
           nxt++;
    if (nxt - cur == 2)
        goto region;
    if ((nxt - cur >= 5) && (nxt - cur <= 8))
        goto variant;
    if (nxt - cur != 4)
        return(0);
    /* we parsed a script */
script:
    if (nxt[0] == 0)
        return(1);
    if (nxt[0] != '-')
        return(0);

    nxt++;
    cur = nxt;
    /* now we can have region or variant */
    if ((nxt[0] >= '0') && (nxt[0] <= '9'))
        goto region_m49;

    while (((nxt[0] >= 'A') && (nxt[0] <= 'Z')) ||
           ((nxt[0] >= 'a') && (nxt[0] <= 'z')))
           nxt++;

    if ((nxt - cur >= 5) && (nxt - cur <= 8))
        goto variant;
    if (nxt - cur != 2)
        return(0);
    /* we parsed a region */
region:
    if (nxt[0] == 0)
        return(1);
    if (nxt[0] != '-')
        return(0);

    nxt++;
    cur = nxt;
    /* now we can just have a variant */
    while (((nxt[0] >= 'A') && (nxt[0] <= 'Z')) ||
           ((nxt[0] >= 'a') && (nxt[0] <= 'z')))
           nxt++;

    if ((nxt - cur < 5) || (nxt - cur > 8))
        return(0);

    /* we parsed a variant */
variant:
    if (nxt[0] == 0)
        return(1);
    if (nxt[0] != '-')
        return(0);
    /* extensions and private use subtags not checked */
    return (1);

region_m49:
    if (((nxt[1] >= '0') && (nxt[1] <= '9')) &&
        ((nxt[2] >= '0') && (nxt[2] <= '9'))) {
        nxt += 3;
        goto region;
    }
    return(0);
}